

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O3

void * mz_zip_extract_archive_file_to_heap
                 (char *pZip_filename,char *pArchive_name,size_t *pSize,mz_uint flags)

{
  mz_bool mVar1;
  mz_uint file_index;
  void *pvVar2;
  mz_zip_archive zip_archive;
  mz_zip_archive local_98;
  
  if (pSize != (size_t *)0x0) {
    *pSize = 0;
  }
  if (pArchive_name != (char *)0x0 && pZip_filename != (char *)0x0) {
    local_98.m_pIO_opaque = (void *)0x0;
    local_98.m_pState = (mz_zip_internal_state *)0x0;
    local_98.m_pWrite = (mz_file_write_func)0x0;
    local_98.m_pNeeds_keepalive = (mz_file_needs_keepalive)0x0;
    local_98.m_pAlloc_opaque = (void *)0x0;
    local_98.m_pRead = (mz_file_read_func)0x0;
    local_98.m_pFree = (mz_free_func)0x0;
    local_98.m_pRealloc = (mz_realloc_func)0x0;
    local_98.m_file_offset_alignment = 0;
    local_98.m_pAlloc = (mz_alloc_func)0x0;
    local_98.m_total_files = 0;
    local_98.m_zip_mode = MZ_ZIP_MODE_INVALID;
    local_98.m_zip_type = MZ_ZIP_TYPE_INVALID;
    local_98.m_last_error = MZ_ZIP_NO_ERROR;
    local_98.m_archive_size = 0;
    local_98.m_central_directory_file_ofs = 0;
    mVar1 = mz_zip_reader_init_file(&local_98,pZip_filename,flags | 0x800);
    if (mVar1 != 0) {
      pvVar2 = (void *)0x0;
      file_index = mz_zip_reader_locate_file(&local_98,pArchive_name,(char *)0x0,flags);
      if (-1 < (int)file_index) {
        pvVar2 = mz_zip_reader_extract_to_heap(&local_98,file_index,pSize,flags);
      }
      mz_zip_reader_end(&local_98);
      return pvVar2;
    }
  }
  return (void *)0x0;
}

Assistant:

void *mz_zip_extract_archive_file_to_heap(const char *pZip_filename,
                                          const char *pArchive_name,
                                          size_t *pSize, mz_uint flags) {
  int file_index;
  mz_zip_archive zip_archive;
  void *p = NULL;

  if (pSize)
    *pSize = 0;

  if ((!pZip_filename) || (!pArchive_name))
    return NULL;

  MZ_CLEAR_OBJ(zip_archive);
  if (!mz_zip_reader_init_file(&zip_archive, pZip_filename,
                               flags |
                                   MZ_ZIP_FLAG_DO_NOT_SORT_CENTRAL_DIRECTORY))
    return NULL;

  if ((file_index = mz_zip_reader_locate_file(&zip_archive, pArchive_name, NULL,
                                              flags)) >= 0)
    p = mz_zip_reader_extract_to_heap(&zip_archive, file_index, pSize, flags);

  mz_zip_reader_end(&zip_archive);
  return p;
}